

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall spirv_cross::Compiler::type_is_block_like(Compiler *this,SPIRType *type)

{
  bool bVar1;
  ParsedIR *this_00;
  uint32_t index;
  
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    this_00 = &this->ir;
    bVar1 = ParsedIR::has_decoration(this_00,(ID)(type->super_IVariant).self.id,DecorationBlock);
    if (bVar1) {
      return true;
    }
    bVar1 = ParsedIR::has_decoration
                      (this_00,(ID)(type->super_IVariant).self.id,DecorationBufferBlock);
    if (bVar1) {
      return true;
    }
    index = 0;
    if ((int)(type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size != 0) {
      do {
        bVar1 = ParsedIR::has_member_decoration
                          (this_00,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset);
        if (bVar1) {
          return bVar1;
        }
        index = index + 1;
      } while (index < (uint)(type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Compiler::type_is_block_like(const SPIRType &type) const
{
	if (type.basetype != SPIRType::Struct)
		return false;

	if (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock))
	{
		return true;
	}

	// Block-like types may have Offset decorations.
	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
		if (has_member_decoration(type.self, i, DecorationOffset))
			return true;

	return false;
}